

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

char * mp_encode_binl(char *data,uint32_t len)

{
  char *pcVar1;
  uint32_t len_local;
  char *data_local;
  
  if (len < 0x100) {
    pcVar1 = mp_store_u8(data,0xc4);
    data_local = mp_store_u8(pcVar1,(uint8_t)len);
  }
  else if (len < 0x10000) {
    pcVar1 = mp_store_u8(data,0xc5);
    data_local = mp_store_u16(pcVar1,(uint16_t)len);
  }
  else {
    pcVar1 = mp_store_u8(data,0xc6);
    data_local = mp_store_u32(pcVar1,len);
  }
  return data_local;
}

Assistant:

MP_IMPL char *
mp_encode_binl(char *data, uint32_t len)
{
	if (len <= UINT8_MAX) {
		data = mp_store_u8(data, 0xc4);
		return mp_store_u8(data, len);
	} else if (len <= UINT16_MAX) {
		data = mp_store_u8(data, 0xc5);
		return mp_store_u16(data, len);
	} else {
		data = mp_store_u8(data, 0xc6);
		return mp_store_u32(data, len);
	}
}